

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint32_t unique_xor(uint16_t *out,uint32_t len)

{
  uint local_1c;
  uint local_18;
  uint32_t i;
  uint32_t pos;
  uint32_t len_local;
  uint16_t *out_local;
  
  local_18 = 1;
  for (local_1c = 1; local_1c < len; local_1c = local_1c + 1) {
    if (out[local_1c] == out[local_1c - 1]) {
      local_18 = local_18 - 1;
    }
    else {
      out[local_18] = out[local_1c];
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

CROARING_UNTARGET_REGION

// working in-place, this function overwrites the repeated values
// could be avoided? Warning: assumes len > 0
static inline uint32_t unique_xor(uint16_t *out, uint32_t len) {
    uint32_t pos = 1;
    for (uint32_t i = 1; i < len; ++i) {
        if (out[i] != out[i - 1]) {
            out[pos++] = out[i];
        } else
            pos--;  // if it is identical to previous, delete it
    }
    return pos;
}